

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Builder * __thiscall
capnp::DynamicStruct::Builder::get(Builder *__return_storage_ptr__,Builder *this,Field field)

{
  byte bVar1;
  ushort uVar2;
  undefined8 uVar3;
  WirePointer *pWVar4;
  CapTableBuilder *pCVar5;
  CapTableBuilder *pCVar6;
  SegmentBuilder *pSVar7;
  StructPointerCount SVar8;
  undefined1 uVar9;
  ListElementCount LVar10;
  BitsPerElementN<23> BVar11;
  void *pvVar12;
  StructDataBitCount SVar13;
  int iVar14;
  ElementSize EVar15;
  Which WVar16;
  uint uVar17;
  StructSize elementSize;
  Schema SVar18;
  StructSchema SVar19;
  ulong uVar20;
  InterfaceSchema IVar21;
  word *pwVar22;
  EnumSchema EVar23;
  byte bVar24;
  ByteCount defaultSize;
  ulong uVar25;
  size_t extraout_RDX;
  uint uVar26;
  ListBuilder *__return_storage_ptr___00;
  ushort uVar27;
  bool bVar28;
  Type TVar29;
  ArrayPtr<const_char> AVar30;
  ArrayPtr<const_unsigned_char> AVar31;
  ArrayPtr<unsigned_char> AVar32;
  Fault f;
  Type type;
  DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> _kjCondition;
  ListSchema listType;
  StructReader local_178;
  Type local_148;
  PointerBuilder local_138;
  undefined1 local_118 [32];
  uint local_f8;
  Type local_e8;
  SegmentBuilder *local_d8;
  Builder *pBStack_d0;
  Builder local_c0;
  StructBuilder local_a8;
  ListBuilder local_80;
  ListBuilder local_58;
  uchar *defaultValue;
  
  local_e8.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)local_e8._0_8_;
  bVar28 = field.parent.super_Schema.raw == (Schema)(this->schema).super_Schema.raw;
  local_118._0_8_ = field.parent.super_Schema.raw;
  local_118._16_8_ = " == ";
  local_118._24_4_ = 5;
  local_118._28_4_ = 0;
  local_f8 = CONCAT31(local_f8._1_3_,bVar28);
  local_118._8_8_ = this;
  if (!bVar28) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema&>&,char_const(&)[39]>
              ((Fault *)&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x10a,FAILED,"field.getContainingStruct() == schema",
               "_kjCondition,\"`field` is not a field of this struct.\"",
               (DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> *)local_118,
               (char (*) [39])"`field` is not a field of this struct.");
    kj::_::Debug::Fault::fatal((Fault *)&local_178);
  }
  SVar18 = field.parent.super_Schema.raw;
  verifySetInUnion(this,field);
  iVar14 = field.proto._reader.nestingLimit;
  SVar8 = field.proto._reader.pointerCount;
  SVar13 = field.proto._reader.dataSize;
  pWVar4 = field.proto._reader.pointers;
  pvVar12 = field.proto._reader.data;
  local_d8 = (SegmentBuilder *)field.proto._reader.segment;
  pBStack_d0 = (Builder *)field.proto._reader.capTable;
  local_148 = StructSchema::Field::getType(&field);
  if (0x4f < SVar13) {
    if (*(short *)((long)pvVar12 + 8) != 1) {
      if (*(short *)((long)pvVar12 + 8) != 0) goto switchD_00385f42_default;
      goto LAB_00385ecf;
    }
    SVar18.raw = (RawBrandedSchema *)Type::asStruct(&local_148);
    pCVar5 = (this->builder).capTable;
    pCVar6 = (CapTableBuilder *)(this->builder).data;
    pWVar4 = (this->builder).pointers;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)(this->builder).segment;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)pCVar5;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = pCVar6;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = (byte *)pWVar4;
    uVar3._0_4_ = (this->builder).dataSize;
    uVar3._4_2_ = (this->builder).pointerCount;
    uVar3._6_2_ = *(undefined2 *)&(this->builder).field_0x26;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x28) = (undefined4)uVar3;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x2c) = (int)((ulong)uVar3 >> 0x20);
    __return_storage_ptr__->type = STRUCT;
    goto LAB_00385f83;
  }
LAB_00385ecf:
  local_118._16_8_ = pWVar4 + 3;
  if (SVar8 < 4) {
    local_118._16_8_ = (WirePointer *)0x0;
  }
  local_118._0_8_ = local_d8;
  local_118._8_8_ = pBStack_d0;
  local_118._24_4_ = iVar14;
  if (SVar8 < 4) {
    local_118._0_8_ = (SegmentBuilder *)0x0;
    local_118._8_8_ = (Builder *)0x0;
    local_118._24_4_ = 0x7fffffff;
  }
  capnp::_::PointerReader::getStruct(&local_178,(PointerReader *)local_118,(word *)0x0);
  WVar16 = LIST;
  if (local_148.listDepth == '\0') {
    WVar16 = local_148.baseType;
  }
  switch(WVar16) {
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    uVar26 = 0;
    if (0x3f < SVar13) {
      uVar26 = *(uint *)((long)pvVar12 + 4);
    }
    if (local_178.dataSize < 0x11) {
      bVar24 = 0;
    }
    else {
      bVar24 = *(byte *)((long)local_178.data + 2) & 1;
    }
    bVar1 = *(byte *)((long)(this->builder).data + (ulong)(uVar26 >> 3));
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = (bool)((bVar1 >> (uVar26 & 7) & 1) != 0 ^ bVar24);
    break;
  case INT8:
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (local_178.dataSize < 0x18) {
      bVar24 = 0;
    }
    else {
      bVar24 = *(byte *)((long)local_178.data + 2);
    }
    bVar1 = *(byte *)((long)(this->builder).data + uVar20);
    __return_storage_ptr__->type = INT;
    SVar18.raw = (RawBrandedSchema *)(long)(char)(bVar24 ^ bVar1);
    goto LAB_00385f83;
  case INT16:
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (local_178.dataSize < 0x20) {
      uVar27 = 0;
    }
    else {
      uVar27 = *(ushort *)((long)local_178.data + 2);
    }
    uVar2 = *(ushort *)((long)(this->builder).data + uVar20 * 2);
    __return_storage_ptr__->type = INT;
    SVar18.raw = (RawBrandedSchema *)(long)(short)(uVar27 ^ uVar2);
    goto LAB_00385f83;
  case INT32:
    uVar26 = 0;
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (0x3f < local_178.dataSize) {
      uVar26 = *(uint *)((long)local_178.data + 4);
    }
    uVar17 = *(uint *)((long)(this->builder).data + uVar20 * 4);
    __return_storage_ptr__->type = INT;
    SVar18.raw = (RawBrandedSchema *)(long)(int)(uVar26 ^ uVar17);
    goto LAB_00385f83;
  case INT64:
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (local_178.dataSize < 0x80) {
      uVar25 = 0;
    }
    else {
      uVar25 = *(ulong *)((long)local_178.data + 8);
    }
    uVar25 = uVar25 ^ *(ulong *)((long)(this->builder).data + uVar20 * 8);
    __return_storage_ptr__->type = INT;
    goto LAB_0038654a;
  case UINT8:
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (local_178.dataSize < 0x18) {
      bVar24 = 0;
    }
    else {
      bVar24 = *(byte *)((long)local_178.data + 2);
    }
    bVar1 = *(byte *)((long)(this->builder).data + uVar20);
    __return_storage_ptr__->type = UINT;
    SVar18.raw = (RawBrandedSchema *)(ulong)(bVar24 ^ bVar1);
    goto LAB_00385f83;
  case UINT16:
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (local_178.dataSize < 0x20) {
      uVar27 = 0;
    }
    else {
      uVar27 = *(ushort *)((long)local_178.data + 2);
    }
    uVar2 = *(ushort *)((long)(this->builder).data + uVar20 * 2);
    __return_storage_ptr__->type = UINT;
    SVar18.raw = (RawBrandedSchema *)(ulong)(uVar27 ^ uVar2);
    goto LAB_00385f83;
  case UINT32:
    uVar26 = 0;
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (0x3f < local_178.dataSize) {
      uVar26 = *(uint *)((long)local_178.data + 4);
    }
    SVar18.raw = (RawBrandedSchema *)
                 (ulong)(uVar26 ^ *(uint *)((long)(this->builder).data + uVar20 * 4));
    __return_storage_ptr__->type = UINT;
LAB_00385f83:
    (__return_storage_ptr__->field_1).structValue.schema.super_Schema.raw = SVar18.raw;
    break;
  case UINT64:
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (local_178.dataSize < 0x80) {
      uVar25 = 0;
    }
    else {
      uVar25 = *(ulong *)((long)local_178.data + 8);
    }
    uVar25 = uVar25 ^ *(ulong *)((long)(this->builder).data + uVar20 * 8);
    __return_storage_ptr__->type = UINT;
    goto LAB_0038654a;
  case FLOAT32:
    uVar26 = 0;
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (0x3f < local_178.dataSize) {
      uVar26 = *(uint *)((long)local_178.data + 4);
    }
    uVar17 = *(uint *)((long)(this->builder).data + uVar20 * 4);
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).floatValue = (double)(float)(uVar26 ^ uVar17);
    break;
  case FLOAT64:
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    if (local_178.dataSize < 0x80) {
      uVar25 = 0;
    }
    else {
      uVar25 = *(ulong *)((long)local_178.data + 8);
    }
    uVar25 = uVar25 ^ *(ulong *)((long)(this->builder).data + uVar20 * 8);
    __return_storage_ptr__->type = FLOAT;
LAB_0038654a:
    (__return_storage_ptr__->field_1).uintValue = uVar25;
    break;
  case TEXT:
    if ((local_178.dataSize < 0x10) || (*local_178.data != 0x12)) {
      AVar30 = (ArrayPtr<const_char>)capnp::schema::Value::Reader::getText((Reader *)&local_178);
      defaultSize = (int)AVar30.size_ - 1;
    }
    else {
      AVar30.size_ = extraout_RDX;
      AVar30.ptr = "";
      defaultSize = 0;
    }
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    local_118._16_8_ = (this->builder).pointers + uVar20;
    local_118._0_8_ = (this->builder).segment;
    local_118._8_8_ = (this->builder).capTable;
    capnp::_::PointerBuilder::getBlob<capnp::Text>
              (&local_c0,(PointerBuilder *)local_118,AVar30.ptr,defaultSize);
    (__return_storage_ptr__->field_1).textValue.content.size_ = local_c0.content.size_;
    (__return_storage_ptr__->field_1).intValue = local_c0._0_8_;
    (__return_storage_ptr__->field_1).textValue.content.ptr = local_c0.content.ptr;
    __return_storage_ptr__->type = TEXT;
    break;
  case DATA:
    if ((local_178.dataSize < 0x10) || (*local_178.data != 0x12)) {
      AVar31 = (ArrayPtr<const_unsigned_char>)
               capnp::schema::Value::Reader::getData((Reader *)&local_178);
      defaultValue = AVar31.ptr;
    }
    else {
      AVar31.size_ = 0;
      AVar31.ptr = (uchar *)local_178.data;
      defaultValue = (uchar *)0x0;
    }
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    local_118._16_8_ = (this->builder).pointers + uVar20;
    local_118._0_8_ = (this->builder).segment;
    local_118._8_8_ = (this->builder).capTable;
    AVar32 = (ArrayPtr<unsigned_char>)
             capnp::_::PointerBuilder::getBlob<capnp::Data>
                       ((PointerBuilder *)local_118,defaultValue,(ByteCount)AVar31.size_);
    __return_storage_ptr__->type = DATA;
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<unsigned_char> = AVar32;
    break;
  case LIST:
    TVar29 = (Type)Type::asList(&local_148);
    local_e8 = TVar29;
    if (TVar29.baseType == STRUCT &&
        ((undefined1  [16])TVar29 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
      if (SVar13 < 0x40) {
        uVar20 = 0;
      }
      else {
        uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
      }
      local_138.pointer = (this->builder).pointers + uVar20;
      local_138.segment = (this->builder).segment;
      local_138.capTable = (this->builder).capTable;
      Type::asStruct(&local_e8);
      elementSize = anon_unknown_71::structSizeFromSchema((StructSchema)SVar18.raw);
      if ((local_178.dataSize < 0x10) || (*local_178.data != 0x12)) {
        bVar28 = local_178.pointerCount != 0;
        local_118._16_8_ = (WirePointer *)0x0;
        if (bVar28) {
          local_118._16_8_ = local_178.pointers;
        }
        local_118._24_4_ = 0x7fffffff;
        if (bVar28) {
          local_118._24_4_ = local_178.nestingLimit;
        }
        local_118._0_8_ = (SegmentBuilder *)0x0;
        local_118._8_8_ = (Builder *)0x0;
        if (bVar28) {
          local_118._0_8_ = local_178.segment;
          local_118._8_8_ = local_178.capTable;
        }
        pwVar22 = capnp::_::PointerReader::getUnchecked((PointerReader *)local_118);
      }
      else {
        pwVar22 = (word *)0x0;
      }
      __return_storage_ptr___00 = &local_58;
      capnp::_::PointerBuilder::getStructList
                (__return_storage_ptr___00,&local_138,elementSize,pwVar22);
    }
    else {
      if (SVar13 < 0x40) {
        uVar20 = 0;
      }
      else {
        uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
      }
      local_138.pointer = (this->builder).pointers + uVar20;
      local_138.segment = (this->builder).segment;
      local_138.capTable = (this->builder).capTable;
      WVar16 = LIST;
      if (((undefined1  [16])TVar29 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
        WVar16 = TVar29.baseType;
      }
      EVar15 = anon_unknown_71::elementSizeFor(WVar16);
      if ((local_178.dataSize < 0x10) || (*local_178.data != 0x12)) {
        bVar28 = local_178.pointerCount != 0;
        local_118._16_8_ = (WirePointer *)0x0;
        if (bVar28) {
          local_118._16_8_ = local_178.pointers;
        }
        local_118._24_4_ = 0x7fffffff;
        if (bVar28) {
          local_118._24_4_ = local_178.nestingLimit;
        }
        local_118._0_8_ = (SegmentBuilder *)0x0;
        local_118._8_8_ = (Builder *)0x0;
        if (bVar28) {
          local_118._0_8_ = local_178.segment;
          local_118._8_8_ = local_178.capTable;
        }
        pwVar22 = capnp::_::PointerReader::getUnchecked((PointerReader *)local_118);
      }
      else {
        pwVar22 = (word *)0x0;
      }
      __return_storage_ptr___00 = &local_80;
      capnp::_::PointerBuilder::getList(__return_storage_ptr___00,&local_138,EVar15,pwVar22);
    }
    SVar8 = __return_storage_ptr___00->structPointerCount;
    EVar15 = __return_storage_ptr___00->elementSize;
    uVar9 = __return_storage_ptr___00->field_0x27;
    *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) =
         __return_storage_ptr___00->structDataSize;
    *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) = SVar8;
    *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = EVar15;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = uVar9;
    pSVar7 = __return_storage_ptr___00->segment;
    pCVar5 = __return_storage_ptr___00->capTable;
    LVar10 = __return_storage_ptr___00->elementCount;
    BVar11 = __return_storage_ptr___00->step;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = __return_storage_ptr___00->ptr;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = LVar10;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = BVar11;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)pSVar7;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = pCVar5;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).listValue.schema.elementType = TVar29;
    break;
  case ENUM:
    if (local_178.dataSize < 0x20) {
      uVar27 = 0;
    }
    else {
      uVar27 = *(ushort *)((long)local_178.data + 2);
    }
    EVar23 = Type::asEnum(&local_148);
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    uVar2 = *(ushort *)((long)(this->builder).data + uVar20 * 2);
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)EVar23.super_Schema.raw;
    *(ushort *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 =
         uVar27 ^ uVar2;
    break;
  case STRUCT:
    SVar19 = Type::asStruct(&local_148);
    uVar26 = 0;
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    local_138.pointer = (this->builder).pointers + uVar20;
    local_138.segment = (this->builder).segment;
    local_138.capTable = (this->builder).capTable;
    local_e8._0_8_ = SVar19.super_Schema.raw;
    Schema::getProto((Reader *)local_118,(Schema *)&local_e8);
    if (local_f8 < 0x80) {
      uVar17 = 0;
    }
    else {
      uVar27 = *(ushort *)((long)&((WirePointer *)(local_118._16_8_ + 8))->field_1 + 2);
      uVar17 = (uint)uVar27;
      if (0xcf < local_f8) {
        uVar26 = (uint)(ushort)(((WirePointer *)(local_118._16_8_ + 0x18))->offsetAndKind).value <<
                 0x10;
        uVar17 = (uint)uVar27;
      }
    }
    if ((local_178.dataSize < 0x10) || (*local_178.data != 0x12)) {
      bVar28 = local_178.pointerCount != 0;
      local_118._16_8_ = (WirePointer *)0x0;
      if (bVar28) {
        local_118._16_8_ = local_178.pointers;
      }
      local_118._24_4_ = 0x7fffffff;
      if (bVar28) {
        local_118._24_4_ = local_178.nestingLimit;
      }
      local_118._0_8_ = (SegmentBuilder *)0x0;
      local_118._8_8_ = (Builder *)0x0;
      if (bVar28) {
        local_118._0_8_ = local_178.segment;
        local_118._8_8_ = local_178.capTable;
      }
      pwVar22 = capnp::_::PointerReader::getUnchecked((PointerReader *)local_118);
    }
    else {
      pwVar22 = (word *)0x0;
    }
    capnp::_::PointerBuilder::getStruct(&local_a8,&local_138,(StructSize)(uVar17 | uVar26),pwVar22);
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.builder.elementCount =
         local_a8._32_8_;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = (CapTableBuilder *)local_a8.data;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = (byte *)local_a8.pointers;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)local_a8.segment;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)local_a8.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).structValue.schema.super_Schema.raw =
         (RawBrandedSchema *)SVar19.super_Schema.raw;
    break;
  case INTERFACE:
    IVar21 = Type::asInterface(&local_148);
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    local_118._16_8_ = (this->builder).pointers + uVar20;
    local_118._0_8_ = (this->builder).segment;
    local_118._8_8_ = (this->builder).capTable;
    capnp::_::PointerBuilder::getCapability(&local_138);
    __return_storage_ptr__->type = CAPABILITY;
    (__return_storage_ptr__->field_1).intValue = (int64_t)local_138.segment;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)local_138.capTable;
    (__return_storage_ptr__->field_1).capabilityValue.schema.super_Schema.raw =
         (RawBrandedSchema *)IVar21.super_Schema.raw;
    break;
  case ANY_POINTER:
    if (SVar13 < 0x40) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*(uint *)((long)pvVar12 + 4);
    }
    pWVar4 = (this->builder).pointers;
    __return_storage_ptr__->type = ANY_POINTER;
    pCVar5 = (this->builder).capTable;
    (__return_storage_ptr__->field_1).intValue = (int64_t)(this->builder).segment;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)pCVar5;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)(pWVar4 + uVar20);
    break;
  default:
switchD_00385f42_default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Builder DynamicStruct::Builder::get(StructSchema::Field field) {
  KJ_REQUIRE(field.getContainingStruct() == schema, "`field` is not a field of this struct.");
  verifySetInUnion(field);

  auto proto = field.getProto();
  auto type = field.getType();
  switch (proto.which()) {
    case schema::Field::SLOT: {
      auto slot = proto.getSlot();

      // Note that the default value might be "anyPointer" even if the type is some pointer type
      // *other than* anyPointer. This happens with generics -- the field is actually a generic
      // parameter that has been bound, but the default value was of course compiled without any
      // binding available.
      auto dval = slot.getDefaultValue();

      switch (type.which()) {
        case schema::Type::VOID:
          return builder.getDataField<Void>(assumeDataOffset(slot.getOffset()));

#define HANDLE_TYPE(discrim, titleCase, type) \
        case schema::Type::discrim: \
          return builder.getDataField<type>( \
              assumeDataOffset(slot.getOffset()), \
              bitCast<_::Mask<type>>(dval.get##titleCase()));

        HANDLE_TYPE(BOOL, Bool, bool)
        HANDLE_TYPE(INT8, Int8, int8_t)
        HANDLE_TYPE(INT16, Int16, int16_t)
        HANDLE_TYPE(INT32, Int32, int32_t)
        HANDLE_TYPE(INT64, Int64, int64_t)
        HANDLE_TYPE(UINT8, Uint8, uint8_t)
        HANDLE_TYPE(UINT16, Uint16, uint16_t)
        HANDLE_TYPE(UINT32, Uint32, uint32_t)
        HANDLE_TYPE(UINT64, Uint64, uint64_t)
        HANDLE_TYPE(FLOAT32, Float32, float)
        HANDLE_TYPE(FLOAT64, Float64, double)

#undef HANDLE_TYPE

        case schema::Type::ENUM: {
          uint16_t typedDval = dval.getEnum();
          return DynamicEnum(type.asEnum(),
              builder.getDataField<uint16_t>(assumeDataOffset(slot.getOffset()), typedDval));
        }

        case schema::Type::TEXT: {
          Text::Reader typedDval = dval.isAnyPointer() ? Text::Reader() : dval.getText();
          return builder.getPointerField(assumePointerOffset(slot.getOffset()))
                        .getBlob<Text>(typedDval.begin(),
                            assumeMax<MAX_TEXT_SIZE>(typedDval.size()) * BYTES);
        }

        case schema::Type::DATA: {
          Data::Reader typedDval = dval.isAnyPointer() ? Data::Reader() : dval.getData();
          return builder.getPointerField(assumePointerOffset(slot.getOffset()))
                        .getBlob<Data>(typedDval.begin(),
                            assumeBits<BLOB_SIZE_BITS>(typedDval.size()) * BYTES);
        }

        case schema::Type::LIST: {
          ListSchema listType = type.asList();
          if (listType.whichElementType() == schema::Type::STRUCT) {
            return DynamicList::Builder(listType,
                builder.getPointerField(assumePointerOffset(slot.getOffset()))
                       .getStructList(structSizeFromSchema(listType.getStructElementType()),
                                      dval.isAnyPointer() ? nullptr :
                                          dval.getList().getAs<_::UncheckedMessage>()));
          } else {
            return DynamicList::Builder(listType,
                builder.getPointerField(assumePointerOffset(slot.getOffset()))
                       .getList(elementSizeFor(listType.whichElementType()),
                                dval.isAnyPointer() ? nullptr :
                                    dval.getList().getAs<_::UncheckedMessage>()));
          }
        }

        case schema::Type::STRUCT: {
          auto structSchema = type.asStruct();
          return DynamicStruct::Builder(structSchema,
              builder.getPointerField(assumePointerOffset(slot.getOffset()))
                     .getStruct(structSizeFromSchema(structSchema),
                                dval.isAnyPointer() ? nullptr :
                                    dval.getStruct().getAs<_::UncheckedMessage>()));
        }

        case schema::Type::ANY_POINTER:
          return AnyPointer::Builder(
              builder.getPointerField(assumePointerOffset(slot.getOffset())));

        case schema::Type::INTERFACE:
          return DynamicCapability::Client(type.asInterface(),
              builder.getPointerField(assumePointerOffset(slot.getOffset())).getCapability());
      }

      KJ_UNREACHABLE;
    }

    case schema::Field::GROUP:
      return DynamicStruct::Builder(type.asStruct(), builder);
  }

  KJ_UNREACHABLE;
}